

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

void restore_trapset(memfile *mf,level *lev)

{
  uint id;
  
  id = mread32(mf);
  if (id == 0) {
    trapinfo_0 = (obj *)0x0;
  }
  else {
    trapinfo_0 = find_oid(lev,id);
  }
  trapinfo_1 = mread8(mf);
  trapinfo_2 = mread8(mf);
  trapinfo_3 = mread32(mf);
  trapinfo_4 = mread8(mf);
  return;
}

Assistant:

void restore_trapset(struct memfile *mf, struct level *lev)
{
	unsigned int tobj_id;

	tobj_id = mread32(mf);
	trapinfo.tobj = tobj_id ? find_oid(lev, tobj_id) : NULL;

	trapinfo.tx = mread8(mf);
	trapinfo.ty = mread8(mf);
	trapinfo.time_needed = mread32(mf);
	trapinfo.force_bungle = mread8(mf);
}